

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

MacroActualArgumentListSyntax * __thiscall
slang::parsing::Preprocessor::MacroParser::parseActualArgumentList
          (MacroParser *this,Token prevToken)

{
  BumpAllocator *pBVar1;
  Preprocessor *this_00;
  _Variadic_union<const_slang::syntax::SyntaxNode_*> _Var2;
  SourceLocation SVar3;
  undefined4 extraout_var;
  MacroActualArgumentListSyntax *pMVar4;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  Token TVar5;
  string_view sVar6;
  Token closeParen;
  Token openParen;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> arguments;
  undefined1 local_148 [16];
  __index_type local_138;
  Token local_130;
  Token local_120;
  Token local_110;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_100 [4];
  
  local_110.info = prevToken.info;
  local_110._0_8_ = prevToken._0_8_;
  TVar5 = peek(this);
  if (TVar5.kind == OpenParenthesis) {
    local_120 = consume(this);
    Token::Token(&local_130);
    local_100[0].len = 0;
    local_100[0].cap = 8;
    local_100[0].data_ = (pointer)local_100[0].firstElement;
    while( true ) {
      pBVar1 = this->pp->alloc;
      local_148 = (undefined1  [16])parseTokenList(this,true);
      _Var2 = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)
              BumpAllocator::
              emplace<slang::syntax::MacroActualArgumentSyntax,std::span<slang::parsing::Token,18446744073709551615ul>>
                        (pBVar1,(span<slang::parsing::Token,_18446744073709551615UL> *)local_148);
      local_138 = '\x01';
      local_148._0_8_ = _Var2;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_100,(TokenOrSyntax *)local_148);
      TVar5 = peek(this);
      if (TVar5.kind != Comma) break;
      local_148 = (undefined1  [16])consume(this);
      local_138 = '\0';
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_100,(TokenOrSyntax *)local_148);
    }
    local_130 = expect(this,CloseParenthesis);
    pBVar1 = this->pp->alloc;
    local_148._0_4_ =
         SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                   (local_100,(EVP_PKEY_CTX *)pBVar1,(EVP_PKEY_CTX *)local_130.info);
    local_148._4_4_ = extraout_var;
    local_148._8_8_ = extraout_RDX._M_extent_value;
    pMVar4 = BumpAllocator::
             emplace<slang::syntax::MacroActualArgumentListSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                       (pBVar1,&local_120,
                        (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)local_148,
                        &local_130);
    if (local_100[0].data_ != (pointer)local_100[0].firstElement) {
      operator_delete(local_100[0].data_);
    }
  }
  else {
    this_00 = this->pp;
    SVar3 = Token::location(&local_110);
    sVar6 = Token::rawText(&local_110);
    Preprocessor::addDiag
              (this_00,(DiagCode)0x50004,(SourceLocation)((long)SVar3 + sVar6._M_len * 0x10000000));
    pMVar4 = (MacroActualArgumentListSyntax *)0x0;
  }
  return pMVar4;
}

Assistant:

MacroActualArgumentListSyntax* Preprocessor::MacroParser::parseActualArgumentList(Token prevToken) {
    // macro has arguments, so we expect to see them here
    if (!peek(TokenKind::OpenParenthesis)) {
        pp.addDiag(diag::ExpectedMacroArgs, prevToken.location() + prevToken.rawText().length());
        return nullptr;
    }

    auto openParen = consume();
    Token closeParen;
    SmallVector<TokenOrSyntax, 8> arguments;
    parseArgumentList(arguments, [this]() { return parseActualArgument(); }, closeParen);

    return pp.alloc.emplace<MacroActualArgumentListSyntax>(openParen, arguments.copy(pp.alloc),
                                                           closeParen);
}